

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdReturn(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint num;
  uint num_00;
  uint uVar1;
  CodeGenRegVmStateContext *pCVar2;
  ExternFuncInfo *pEVar3;
  uint uVar4;
  ulong uVar5;
  x86Reg reg2;
  uint num_01;
  uint shift;
  uint *puVar6;
  
  pCVar2 = ctx->vmState;
  pCVar2->checkedReturnWrap = CheckedReturnWrap;
  pCVar2->errorNoReturnWrap = ErrorNoReturnWrap;
  num_01 = cmd._2_4_ & 0xff;
  if (num_01 == 5) {
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
    EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDI,0x168,ctx->currInstructionPos);
    EMIT_REG_READ(&ctx->ctx,rEDI);
    EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xf0);
  }
  else {
    uVar5 = (ulong)ctx->currFunctionId;
    if (uVar5 != 0) {
      pEVar3 = ctx->exFunctions;
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_sub64,sQWORD,rR13,0x108,
                       pEVar3[uVar5].stackSize + 0xf & 0xfffffff0);
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_sub64,sQWORD,rR13,0x140,pEVar3[uVar5].regVmRegisters << 3);
    }
    if (((ulong)cmd & 0xff0000) != 0) {
      uVar5 = (ulong)cmd >> 0x20;
      puVar6 = ctx->exRegVmConstants;
      num = puVar6[uVar5];
      if (puVar6[uVar5 + 2] != 7) {
        puVar6 = puVar6 + uVar5 + 2;
        EMIT_OP_REG_NUM64(&ctx->ctx,o_mov64,rEBP,
                          (unsigned_long_long)ctx->vmState->tempStackArrayBase);
        uVar4 = *puVar6;
        if (uVar4 != 7) {
          shift = 0;
          do {
            switch(uVar4) {
            case 2:
              EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,puVar6[1] << 3);
              EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,shift,rEAX);
              goto LAB_002aa4a2;
            case 3:
              EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,puVar6[1] << 3);
              goto LAB_002aa4f0;
            case 4:
              EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,shift,puVar6[1]);
LAB_002aa4a2:
              puVar6 = puVar6 + 2;
              shift = shift + 4;
              break;
            case 5:
              EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,puVar6[1]);
LAB_002aa4f0:
              puVar6 = puVar6 + 2;
              EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,rEAX);
              shift = shift + 8;
              break;
            case 6:
              uVar4 = puVar6[1];
              num_00 = puVar6[2];
              uVar1 = puVar6[3];
              if (uVar4 == 3) {
                reg2 = rEBX;
LAB_002aa548:
                EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,reg2);
              }
              else {
                if (uVar4 == 2) {
                  reg2 = rR14;
                  goto LAB_002aa548;
                }
                if (uVar4 == 1) {
                  reg2 = rR15;
                  goto LAB_002aa548;
                }
                EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,uVar4 << 3);
              }
              puVar6 = puVar6 + 4;
              EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,num_00);
              EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,shift);
              EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar1 >> 2);
              EMIT_OP(&ctx->ctx,o_rep_movsd);
              shift = shift + uVar1;
              break;
            default:
              puVar6 = puVar6 + 1;
            }
            uVar4 = *puVar6;
          } while (uVar4 != 7);
        }
      }
      if (cmd.rC != '\0') {
        EMIT_OP_REG_NUM64(&ctx->ctx,o_mov64,rEDI,(unsigned_long_long)ctx->vmState);
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEDX,num);
        EMIT_REG_READ(&ctx->ctx,rESI);
        EMIT_REG_READ(&ctx->ctx,rEDX);
        EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xd8);
      }
    }
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,num_01);
  }
  EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESP,0x28);
  EMIT_OP_REG(&ctx->ctx,o_pop,rR15);
  EMIT_OP_REG(&ctx->ctx,o_pop,rEBX);
  EMIT_OP(&ctx->ctx,o_ret);
  return;
}

Assistant:

void GenCodeCmdReturn(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->checkedReturnWrap = CheckedReturnWrap;
	ctx.vmState->errorNoReturnWrap = ErrorNoReturnWrap;

#if defined(_M_X64)
	if(cmd.rB == rvrError)
	{
		EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
		EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->callInstructionPos) - uintptr_t(ctx.vmState)), ctx.currInstructionPos);
		EMIT_REG_READ(ctx.ctx, rArg1);
		EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->errorNoReturnWrap) - uintptr_t(ctx.vmState)));

		EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSP, 40);
		EMIT_OP_REG(ctx.ctx, o_pop, rR15);
		EMIT_OP_REG(ctx.ctx, o_pop, rRBX);
		EMIT_OP(ctx.ctx, o_ret);

		return;
	}

	if(unsigned functionId = ctx.currFunctionId)
	{
		ExternFuncInfo &target = ctx.exFunctions[functionId];

		unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

		// Restore frame top
		EMIT_OP_RPTR_NUM(ctx.ctx, o_sub64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, dataStackTop), stackSize); // vmState->dataStackTop -= stackSize;

		// Restore register top
		EMIT_OP_RPTR_NUM(ctx.ctx, o_sub64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop -= target.regVmRegisters;
	}

	if(cmd.rB != rvrVoid)
	{
		unsigned *microcode = ctx.exRegVmConstants + cmd.argument;

		unsigned typeId = *microcode++;
		microcode++; // Skip type size

		x86Reg rTempStack = rRBP;

		if(*microcode != rvmiReturn)
			EMIT_OP_REG_NUM64(ctx.ctx, o_mov64, rTempStack, (uintptr_t)ctx.vmState->tempStackArrayBase);

		unsigned tempStackPtrOffset = 0;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPush:
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
				tempStackPtrOffset += sizeof(int);
				break;
			case rvmiPushQword:
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, *microcode++ * 8);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
				tempStackPtrOffset += sizeof(long long);
				break;
			case rvmiPushImm:
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
				tempStackPtrOffset += sizeof(int);
				break;
			case rvmiPushImmq:
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, *microcode++);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
				tempStackPtrOffset += sizeof(long long);
				break;
			case rvmiPushMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;

				if(reg == rvrrFrame)
					EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
				else if(reg == rvrrConstants)
					EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
				else if(reg == rvrrRegisters)
					EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
				else
					EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, reg * 8);

				EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSI, offset);
				EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRDI, sQWORD, rTempStack, tempStackPtrOffset);
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
				EMIT_OP(ctx.ctx, o_rep_movsd);

				tempStackPtrOffset += size;
			}
			break;
			}
		}

		// Checked return value
		if(cmd.rC)
		{
			EMIT_OP_REG_NUM64(ctx.ctx, o_mov64, rArg1, uintptr_t(ctx.vmState));
			EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg2, rR15);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rArg3, typeId);
			EMIT_REG_READ(ctx.ctx, rArg2);
			EMIT_REG_READ(ctx.ctx, rArg3);
			EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->checkedReturnWrap) - uintptr_t(ctx.vmState)));
		}
	}

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
	ctx.ctx.KillLateUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, cmd.rB);
	EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSP, 40);
	EMIT_OP_REG(ctx.ctx, o_pop, rR15);
	EMIT_OP_REG(ctx.ctx, o_pop, rRBX);
	EMIT_OP(ctx.ctx, o_ret);
#else
	if(cmd.rB == rvrError)
	{
		EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->callInstructionPos), ctx.currInstructionPos);
		EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
		EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->errorNoReturnWrap));
		return;
	}

	if(unsigned functionId = ctx.currFunctionId)
	{
		ExternFuncInfo &target = ctx.exFunctions[functionId];

		unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

		// Restore frame top
		EMIT_OP_RPTR_NUM(ctx.ctx, o_sub, sDWORD, uintptr_t(&ctx.vmState->dataStackTop), stackSize); // vmState->dataStackTop -= stackSize;

		// Restore register top
		EMIT_OP_RPTR_NUM(ctx.ctx, o_sub, sDWORD, uintptr_t(&ctx.vmState->regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop -= target.regVmRegisters;
	}

	if(cmd.rB != rvrVoid)
	{
		unsigned *microcode = ctx.exRegVmConstants + cmd.argument;

		unsigned typeId = *microcode++;
		microcode++; // Skip type size

		unsigned tempStackPtrOffset = 0;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPush:
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
				EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset, rEAX);
				tempStackPtrOffset += sizeof(int);
				break;
			case rvmiPushQword:
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode * 8);
				EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset, rEAX);
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8 + 4);
				EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset + 4, rEAX);
				tempStackPtrOffset += sizeof(long long);
				break;
			case rvmiPushImm:
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset, *microcode++);
				tempStackPtrOffset += sizeof(int);
				break;
			case rvmiPushImmq:
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, *microcode++);
				EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset, rEAX);
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset + 4, 0);
				tempStackPtrOffset += sizeof(long long);
				break;
			case rvmiPushMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;

				EMIT_OP_REG_REG(ctx.ctx, o_mov, rEDX, rESI); // Save frame register
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, reg * 8);
				EMIT_OP_REG_NUM(ctx.ctx, o_add, rESI, offset);
				EMIT_OP_REG_ADDR(ctx.ctx, o_lea, rEDI, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
				EMIT_OP(ctx.ctx, o_rep_movsd);
				EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEDX); // Restore frame register
				EMIT_REG_READ(ctx.ctx, rESI);

				tempStackPtrOffset += size;
			}
			break;
			}
		}

		// Checked return value
		if(cmd.rC)
		{
			EMIT_OP_NUM(ctx.ctx, o_push, typeId);
			EMIT_OP_REG(ctx.ctx, o_push, rESI);
			EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
			EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->checkedReturnWrap));
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 12);
		}
	}

	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, cmd.rB);
	EMIT_OP_REG(ctx.ctx, o_pop, rESI);
	EMIT_OP_REG(ctx.ctx, o_pop, rEBX);
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rESP, rEBP);
	EMIT_REG_READ(ctx.ctx, rESP);
	EMIT_OP_REG(ctx.ctx, o_pop, rEBP);
	EMIT_OP(ctx.ctx, o_ret);
#endif
}